

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::mousePressEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  Representation RVar1;
  bool bVar2;
  MouseButton MVar3;
  int iVar4;
  int iVar5;
  QObject *pQVar6;
  QMdiSubWindowPrivate *this_00;
  QPoint QVar7;
  QRect *pQVar8;
  QMdiSubWindowPrivate *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *d;
  SubWindowOption in_stack_ffffffffffffffac;
  QMouseEvent *in_stack_ffffffffffffffb8;
  QMdiSubWindowPrivate *this_01;
  QRegion local_30 [2];
  QMdiSubWindowPrivate *this_02;
  
  this_02 = *(QMdiSubWindowPrivate **)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar6 = QObject::parent((QObject *)0x635f7f);
  if (pQVar6 == (QObject *)0x0) {
    QWidget::mousePressEvent((QWidget *)in_RSI,in_stack_ffffffffffffffb8);
  }
  else {
    this_00 = d_func((QMdiSubWindow *)0x635fa3);
    if ((this_00->isInInteractiveMode & 1U) != 0) {
      QMdiSubWindowPrivate::leaveInteractiveMode(in_RDI);
    }
    if ((this_00->isInRubberBandMode & 1U) != 0) {
      QMdiSubWindowPrivate::leaveRubberBandMode(in_RSI);
    }
    MVar3 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
    if (MVar3 == LeftButton) {
      if (this_00->currentOperation == None) {
        this_00->activeSubControl = this_00->hoveredSubControl;
        if (this_00->activeSubControl == SC_ComboBoxFrame) {
          showSystemMenu(local_30[2].d);
        }
        else {
          iVar4 = QWidget::width((QWidget *)0x63612d);
          iVar5 = QMdiSubWindowPrivate::titleBarHeight(this_01);
          QRegion::QRegion(local_30,0,0,iVar4,iVar5,Rectangle);
          QWidget::update((QWidget *)in_RSI,(QRegion *)this_00);
          QRegion::~QRegion(local_30);
        }
      }
      else {
        QMdiSubWindowPrivate::updateCursor(in_RSI);
        join_0x00001240_0x00001200_ = QSinglePointEvent::position((QSinglePointEvent *)0x63601c);
        QPointF::toPoint((QPointF *)in_RSI);
        QVar7 = QWidget::mapToParent((QWidget *)this_00,(QPoint *)in_RDI);
        this_00->mousePressPosition = QVar7;
        if (((this_00->resizeEnabled & 1U) != 0) || ((this_00->moveEnabled & 1U) != 0)) {
          pQVar8 = QWidget::geometry((QWidget *)in_RDI);
          RVar1.m_i = (pQVar8->y1).m_i;
          (this_00->oldGeometry).x1 = (Representation)(pQVar8->x1).m_i;
          (this_00->oldGeometry).y1 = (Representation)RVar1.m_i;
          RVar1.m_i = (pQVar8->y2).m_i;
          (this_00->oldGeometry).x2 = (Representation)(pQVar8->x2).m_i;
          (this_00->oldGeometry).y2 = (Representation)RVar1.m_i;
        }
        bVar2 = testOption((QMdiSubWindow *)in_RDI,in_stack_ffffffffffffffac);
        if (((bVar2) && (bVar2 = QMdiSubWindowPrivate::isResizeOperation(this_00), bVar2)) ||
           ((bVar2 = testOption((QMdiSubWindow *)in_RDI,in_stack_ffffffffffffffac), bVar2 &&
            (bVar2 = QMdiSubWindowPrivate::isMoveOperation(this_00), bVar2)))) {
          QMdiSubWindowPrivate::enterRubberBandMode(this_02);
        }
      }
    }
    else {
      QEvent::ignore((QEvent *)in_RSI);
    }
  }
  if (*(QMdiSubWindowPrivate **)(in_FS_OFFSET + 0x28) != this_02) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::mousePressEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mousePressEvent(mouseEvent);
        return;
    }

    Q_D(QMdiSubWindow);
    if (d->isInInteractiveMode)
        d->leaveInteractiveMode();
#if QT_CONFIG(rubberband)
    if (d->isInRubberBandMode)
        d->leaveRubberBandMode();
#endif

    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }

    if (d->currentOperation != QMdiSubWindowPrivate::None) {
        d->updateCursor();
        d->mousePressPosition = mapToParent(mouseEvent->position().toPoint());
        if (d->resizeEnabled || d->moveEnabled)
            d->oldGeometry = geometry();
#if QT_CONFIG(rubberband)
        if ((testOption(QMdiSubWindow::RubberBandResize) && d->isResizeOperation())
            || (testOption(QMdiSubWindow::RubberBandMove) && d->isMoveOperation())) {
            d->enterRubberBandMode();
        }
#endif
        return;
    }

    d->activeSubControl = d->hoveredSubControl;
#if QT_CONFIG(menu)
    if (d->activeSubControl == QStyle::SC_TitleBarSysMenu)
        showSystemMenu();
    else
#endif
    update(QRegion(0, 0, width(), d->titleBarHeight()));
}